

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O2

void __thiscall gdsForge::gdsARef(gdsForge *this,gdsAREF *in_AREF,bool minimal)

{
  double dVar1;
  undefined7 in_register_00000011;
  int data [1];
  double arrDou [1];
  undefined8 local_88;
  bitset<16UL> bits;
  string local_78;
  string local_58;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  GDSwriteRec(this,0xb00);
  if ((int)CONCAT71(in_register_00000011,minimal) == 0) {
    data[0] = in_AREF->plex;
    GDSwriteInt(this,0x2f03,data,1);
  }
  std::__cxx11::string::string((string *)&local_58,(string *)&in_AREF->name);
  GDSwriteStr(this,0x1206,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  bits.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
  std::bitset<16UL>::set(&bits,0xf,in_AREF->reflection);
  std::bitset<16UL>::set(&bits,2,(bool)(-(in_AREF->scale != 1.0) & 1));
  std::bitset<16UL>::set(&bits,1,(bool)(-(in_AREF->angle != 0.0) & 1));
  GDSwriteBitArr(this,0x1a01,bits);
  dVar1 = in_AREF->scale;
  if ((dVar1 != 1.0) || (NAN(dVar1))) {
    arrDou[0] = dVar1;
    GDSwriteRea(this,0x1b05,arrDou,1);
  }
  dVar1 = in_AREF->angle;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    arrDou[0] = dVar1;
    GDSwriteRea(this,0x1c05,arrDou,1);
  }
  local_88._0_4_ = in_AREF->colCnt;
  local_88._4_4_ = in_AREF->rowCnt;
  GDSwriteInt(this,0x1302,(int *)&local_88,2);
  local_38._0_4_ = in_AREF->xCor;
  local_38._4_4_ = in_AREF->yCor;
  uStack_30._0_4_ = in_AREF->xCorRow;
  uStack_30._4_4_ = in_AREF->yCorRow;
  local_28._0_4_ = in_AREF->xCorCol;
  local_28._4_4_ = in_AREF->yCorCol;
  GDSwriteInt(this,0x1003,(int *)&local_38,6);
  if (!minimal) {
    data[0] = in_AREF->propattr;
    GDSwriteInt(this,0x2b02,data,1);
    std::__cxx11::string::string((string *)&local_78,(string *)&in_AREF->propvalue);
    GDSwriteStr(this,0x2c06,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  GDSwriteRec(this,0x1100);
  return;
}

Assistant:

void gdsForge::gdsARef(const gdsAREF &in_AREF, bool minimal)
{
  int data[1];
  this->GDSwriteRec(GDS_AREF);

  // ELFLAGS and PLEX are optional
  if (minimal == false) {
    data[0] = in_AREF.plex;
    this->GDSwriteInt(GDS_PLEX, data, 1);
  }

  // name of the structure that is referenced
  this->GDSwriteStr(GDS_SNAME, in_AREF.name);

  // two byte, bit array controlling reflection, magnification and rotation.
  bitset<16> bits;

  // reflect across x-axis
  bits.set(15, in_AREF.reflection);

  // magnification, default 1
  if (in_AREF.scale == 1)
    bits.set(2, 0);
  else
    bits.set(2, 1);

  // angle of rotation
  if (in_AREF.angle == 0)
    bits.set(1, 0);
  else
    bits.set(1, 1);

  this->GDSwriteBitArr(GDS_STRANS, bits);

  double arrDou[1];
  // Magnification, default 1
  if (in_AREF.scale != 1) {
    arrDou[0] = in_AREF.scale;
    this->GDSwriteRea(GDS_MAG, arrDou, 1);
  }

  // Angle measured counterclockwise
  if (in_AREF.angle != 0) {
    arrDou[0] = in_AREF.angle;
    this->GDSwriteRea(GDS_ANGLE, arrDou, 1);
  }

  int colrow[2];
  colrow[0] = in_AREF.colCnt;
  colrow[1] = in_AREF.rowCnt;
  this->GDSwriteInt(GDS_COLROW, colrow, 2);

  int corXY[6];
  corXY[0] = in_AREF.xCor;
  corXY[1] = in_AREF.yCor;
  corXY[2] = in_AREF.xCorRow;
  corXY[3] = in_AREF.yCorRow;
  corXY[4] = in_AREF.xCorCol;
  corXY[5] = in_AREF.yCorCol;
  this->GDSwriteInt(GDS_XY, corXY, 6);

  // Optional goodies
  if (minimal == false) {
    data[0] = in_AREF.propattr;
    this->GDSwriteInt(GDS_PROPATTR, data, 1);
    this->GDSwriteStr(GDS_PROPVALUE, in_AREF.propvalue);
  }

  this->GDSwriteRec(GDS_ENDEL);
}